

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageFieldNoLabel
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  Tokenizer *pTVar4;
  pointer pcVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  void *pvVar9;
  undefined4 uVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  string *psVar14;
  DescriptorProto *message;
  undefined8 *puVar15;
  long *plVar16;
  Arena *pAVar17;
  ArenaStringPtr *pAVar18;
  long lVar19;
  RepeatedField<int> *this_00;
  ulong uVar20;
  bool bVar21;
  string_view text;
  ErrorMaker error;
  ErrorMaker error_00;
  string_view text_00;
  string_view text_01;
  Type type;
  Token name_token;
  MapField map_field;
  undefined1 local_100 [48];
  RepeatedPtrFieldBase *local_d0;
  undefined4 local_c4;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  undefined1 local_b0 [32];
  ColumnNumber local_90;
  pointer local_88;
  MapField local_80;
  
  paVar2 = &local_80.key_type_name.field_2;
  local_80.is_map_field = false;
  local_80.key_type_name._M_string_length = 0;
  local_80.key_type_name.field_2._M_local_buf[0] = '\0';
  local_80.value_type_name._M_dataplus._M_p = (pointer)&local_80.value_type_name.field_2;
  local_80.value_type_name._M_string_length = 0;
  local_80.value_type_name.field_2._M_local_buf[0] = '\0';
  local_d0 = &messages->super_RepeatedPtrFieldBase;
  local_c4 = location_field_number_for_nested_type;
  local_88 = (pointer)parent_location;
  local_80.key_type_name._M_dataplus._M_p = (pointer)paVar2;
  LocationRecorder::LocationRecorder((LocationRecorder *)local_100,field_location);
  LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_100,&field->super_Message,TYPE);
  local_100._24_4_ = 5;
  local_b8._M_p = (char *)0x0;
  local_b0[0] = '\0';
  text._M_str = "map";
  text._M_len = 3;
  local_c0 = (undefined1  [8])local_b0;
  bVar11 = TryConsume(this,text);
  if (bVar11) {
    if (((this->input_->current_).text._M_string_length != 1) ||
       (iVar13 = bcmp((this->input_->current_).text._M_dataplus._M_p,"<",1), iVar13 != 0)) {
      bVar11 = true;
      std::__cxx11::string::_M_replace((ulong)local_c0,0,local_b8._M_p,0x343371);
      goto LAB_001cd2d7;
    }
    local_80.is_map_field = true;
    bVar11 = ParseMapType(this,&local_80,field,(LocationRecorder *)local_100);
    if (bVar11) goto LAB_001cd2d5;
LAB_001cd3a5:
    if (local_c0 != (undefined1  [8])local_b0) {
      operator_delete((void *)local_c0,CONCAT71(local_b0._1_7_,local_b0[0]) + 1);
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
    bVar11 = false;
    goto LAB_001cd821;
  }
LAB_001cd2d5:
  bVar11 = false;
LAB_001cd2d7:
  if (local_80.is_map_field == false) {
    if (((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x200) ==
         (undefined1  [80])0x0) && (bVar12 = DefaultToOptionalFields(this), bVar12)) {
      bVar12 = FieldDescriptorProto_Label_IsValid(1);
      if (!bVar12) goto LAB_001cd91e;
      (field->field_0)._impl_.label_ = 1;
      pbVar1 = (byte *)((long)&field->field_0 + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    if ((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x200) ==
        (undefined1  [80])0x0) {
      RecordError(this,(ErrorMaker)ZEXT816(0x343377));
      bVar12 = FieldDescriptorProto_Label_IsValid(1);
      if (!bVar12) {
LAB_001cd91e:
        __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
                      ,0x37b2,
                      "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                     );
      }
      (field->field_0)._impl_.label_ = 1;
      pbVar1 = (byte *)((long)&field->field_0 + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    if ((!bVar11) &&
       (bVar11 = ParseType(this,(Type *)(local_100 + 0x18),(string *)local_c0), !bVar11))
    goto LAB_001cd3a5;
    this_00 = &(((anon_union_96_1_493b367e_for_SourceCodeInfo_Location_4 *)(local_100._16_8_ + 0x10)
                )->_impl_).path_;
    if (local_b8._M_p == (char *)0x0) {
      RepeatedField<int>::Add(this_00,5);
      uVar10 = local_100._24_4_;
      bVar11 = FieldDescriptorProto_Type_IsValid(local_100._24_4_);
      if (!bVar11) {
        __assert_fail("::google::protobuf::FieldDescriptorProto_Type_IsValid(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
                      ,0x37cf,
                      "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                     );
      }
      (field->field_0)._impl_.type_ = uVar10;
      pbVar1 = (byte *)((long)&field->field_0 + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    else {
      RepeatedField<int>::Add(this_00,6);
      *(byte *)&field->field_0 = *(byte *)&field->field_0 | 4;
      pAVar17 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar17 & 1) != 0) {
        pAVar17 = *(Arena **)((ulong)pAVar17 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(field->field_0)._impl_.type_name_,(string *)local_c0,pAVar17);
    }
  }
  if (local_c0 != (undefined1  [8])local_b0) {
    operator_delete((void *)local_c0,CONCAT71(local_b0._1_7_,local_b0[0]) + 1);
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
  pTVar4 = this->input_;
  local_c0._0_4_ = (pTVar4->current_).type;
  local_b8._M_p = local_b0 + 8;
  pcVar5 = (pTVar4->current_).text._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar5,pcVar5 + (pTVar4->current_).text._M_string_length);
  local_90 = (pTVar4->current_).end_column;
  local_b0._24_4_ = (pTVar4->current_).line;
  local_b0._28_4_ = (pTVar4->current_).column;
  LocationRecorder::LocationRecorder((LocationRecorder *)local_100,field_location,1);
  LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_100,&field->super_Message,NAME);
  *(byte *)&field->field_0 = *(byte *)&field->field_0 | 1;
  pAVar17 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar17 & 1) != 0) {
    pAVar17 = *(Arena **)((ulong)pAVar17 & 0xfffffffffffffffe);
  }
  pAVar18 = &(field->field_0)._impl_.name_;
  psVar14 = internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar18,pAVar17);
  bVar11 = ConsumeIdentifier(this,psVar14,(ErrorMaker)ZEXT816(0x3433a7));
  if (bVar11) {
    puVar15 = (undefined8 *)((ulong)(pAVar18->tagged_ptr_).ptr_ & 0xfffffffffffffffc);
    lVar6 = puVar15[1];
    bVar12 = lVar6 == 0;
    if (!bVar12) {
      pcVar7 = (char *)*puVar15;
      cVar3 = *pcVar7;
      if ((((byte)(cVar3 - 0x30U) < 10) || (cVar3 == '_')) || ((byte)(cVar3 + 0x9fU) < 0x1a)) {
        lVar19 = 1;
        do {
          bVar12 = lVar6 == lVar19;
          if (bVar12) break;
          cVar3 = pcVar7[lVar19];
          lVar19 = lVar19 + 1;
        } while ((((byte)(cVar3 - 0x30U) < 10) || (cVar3 == '_')) || ((byte)(cVar3 + 0x9fU) < 0x1a))
        ;
      }
    }
    if (!bVar12) {
      error.func_ = ErrorMaker::
                    ErrorMaker<google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_0,void>(google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_0)
                    ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
      error.field_0.error_ = (char *)field;
      RecordWarning(this,error);
    }
    plVar16 = (long *)((ulong)(pAVar18->tagged_ptr_).ptr_ & 0xfffffffffffffffc);
    uVar8 = plVar16[1];
    bVar12 = 1 < uVar8;
    if (bVar12) {
      lVar6 = *plVar16;
      uVar20 = 2;
      do {
        if (((byte)(*(char *)(lVar6 + -1 + uVar20) - 0x30U) < 10) &&
           (*(char *)(lVar6 + -2 + uVar20) == '_')) break;
        bVar12 = uVar20 < uVar8;
        bVar21 = uVar20 != uVar8;
        uVar20 = uVar20 + 1;
      } while (bVar21);
    }
    if (bVar12) {
      error_00.func_ =
           ErrorMaker::
           ErrorMaker<google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_1,void>(google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_1)
           ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
      error_00.field_0.error_ = (char *)field;
      RecordWarning(this,error_00);
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
    if ((!bVar11) ||
       ((text_00._M_str = "=", text_00._M_len = 1, bVar11 = TryConsume(this,text_00), !bVar11 &&
        (RecordError(this,(ErrorMaker)ZEXT816(0x3433bc)), !bVar11)))) goto LAB_001cd803;
    LocationRecorder::LocationRecorder((LocationRecorder *)local_100,field_location,3);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_100,&field->super_Message,NUMBER);
    bVar11 = ConsumeInteger(this,(int *)(local_100 + 0x18),(ErrorMaker)ZEXT816(0x3433d2));
    if (!bVar11) goto LAB_001cd7f9;
    (field->field_0)._impl_.number_ = local_100._24_4_;
    *(byte *)&field->field_0 = *(byte *)&field->field_0 | 0x40;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
    bVar11 = ParseFieldOptions(this,field,field_location,containing_file);
    if (!bVar11) goto LAB_001cd803;
    if (((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x400) ==
         (undefined1  [80])0x0) || ((field->field_0)._impl_.type_ != 10)) {
      text_01._M_str = ";";
      text_01._M_len = 1;
      bVar11 = ConsumeEndOfDeclaration(this,text_01,field_location);
    }
    else {
      LocationRecorder::LocationRecorder((LocationRecorder *)local_100,(LocationRecorder *)local_88)
      ;
      LocationRecorder::StartAt((LocationRecorder *)local_100,field_location);
      RepeatedField<int>::Add
                (&(((anon_union_96_1_493b367e_for_SourceCodeInfo_Location_4 *)
                   (local_100._16_8_ + 0x10))->_impl_).path_,local_c4);
      RepeatedField<int>::Add
                (&(((anon_union_96_1_493b367e_for_SourceCodeInfo_Location_4 *)
                   (local_100._16_8_ + 0x10))->_impl_).path_,local_d0->current_size_);
      message = (DescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (local_d0,Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
      pvVar9 = (pAVar18->tagged_ptr_).ptr_;
      (message->field_0)._impl_._has_bits_.has_bits_[0] =
           (message->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      pAVar18 = &(message->field_0)._impl_.name_;
      pAVar17 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar17 & 1) != 0) {
        pAVar17 = *(Arena **)((ulong)pAVar17 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (pAVar18,(string *)((ulong)pvVar9 & 0xfffffffffffffffc),pAVar17);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)(local_100 + 0x18),(LocationRecorder *)local_100,1);
      LocationRecorder::StartAt((LocationRecorder *)(local_100 + 0x18),(Token *)local_c0);
      LocationRecorder::EndAt((LocationRecorder *)(local_100 + 0x18),(Token *)local_c0);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)(local_100 + 0x18),(Message *)message,NAME);
      LocationRecorder::~LocationRecorder((LocationRecorder *)(local_100 + 0x18));
      LocationRecorder::LocationRecorder((LocationRecorder *)(local_100 + 0x18),field_location,6);
      LocationRecorder::StartAt((LocationRecorder *)(local_100 + 0x18),(Token *)local_c0);
      LocationRecorder::EndAt((LocationRecorder *)(local_100 + 0x18),(Token *)local_c0);
      LocationRecorder::~LocationRecorder((LocationRecorder *)(local_100 + 0x18));
      if ((byte)(**(char **)((ulong)(pAVar18->tagged_ptr_).ptr_ & 0xfffffffffffffffc) + 0xa5U) <
          0xe6) {
        RecordError(this,local_b0._24_4_,local_b0._28_4_,(ErrorMaker)ZEXT816(0x3433e9));
      }
      psVar14 = FieldDescriptorProto::mutable_name_abi_cxx11_(field);
      absl::lts_20240722::AsciiStrToLower((string *)psVar14);
      pvVar9 = (pAVar18->tagged_ptr_).ptr_;
      (field->field_0)._impl_._has_bits_.has_bits_[0] =
           (field->field_0)._impl_._has_bits_.has_bits_[0] | 4;
      pAVar17 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar17 & 1) != 0) {
        pAVar17 = *(Arena **)((ulong)pAVar17 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(field->field_0)._impl_.type_name_,(string *)((ulong)pvVar9 & 0xfffffffffffffffc),
                 pAVar17);
      if (((this->input_->current_).text._M_string_length != 1) ||
         (iVar13 = bcmp((this->input_->current_).text._M_dataplus._M_p,"{",1), iVar13 != 0)) {
        RecordError(this,(ErrorMaker)ZEXT816(0x343417));
        goto LAB_001cd7f9;
      }
      bVar11 = ParseMessageBlock(this,message,(LocationRecorder *)local_100,containing_file);
      this = (Parser *)local_100;
      LocationRecorder::~LocationRecorder((LocationRecorder *)this);
    }
    if (!bVar11) goto LAB_001cd803;
    bVar11 = true;
    if (local_80.is_map_field == true) {
      GenerateMapEntry(this,&local_80,field,
                       (RepeatedPtrField<google::protobuf::DescriptorProto> *)local_d0);
    }
  }
  else {
LAB_001cd7f9:
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
LAB_001cd803:
    bVar11 = false;
  }
  if (local_b8._M_p != local_b0 + 8) {
    operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
  }
LAB_001cd821:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.value_type_name._M_dataplus._M_p != &local_80.value_type_name.field_2) {
    operator_delete(local_80.value_type_name._M_dataplus._M_p,
                    CONCAT71(local_80.value_type_name.field_2._M_allocated_capacity._1_7_,
                             local_80.value_type_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.key_type_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.key_type_name._M_dataplus._M_p,
                    CONCAT71(local_80.key_type_name.field_2._M_allocated_capacity._1_7_,
                             local_80.key_type_name.field_2._M_local_buf[0]) + 1);
  }
  return bVar11;
}

Assistant:

bool Parser::ParseMessageFieldNoLabel(
    FieldDescriptorProto* field, RepeatedPtrField<DescriptorProto>* messages,
    const LocationRecorder& parent_location,
    int location_field_number_for_nested_type,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  MapField map_field;
  // Parse type.
  {
    LocationRecorder location(field_location);  // add path later
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::TYPE);

    bool type_parsed = false;
    FieldDescriptorProto::Type type = FieldDescriptorProto::TYPE_INT32;
    std::string type_name;

    // Special case map field. We only treat the field as a map field if the
    // field type name starts with the word "map" with a following "<".
    if (TryConsume("map")) {
      if (LookingAt("<")) {
        map_field.is_map_field = true;
        DO(ParseMapType(&map_field, field, location));
      } else {
        // False positive
        type_parsed = true;
        type_name = "map";
      }
    }
    if (!map_field.is_map_field) {
      // Handle the case where no explicit label is given for a non-map field.
      if (!field->has_label() && DefaultToOptionalFields()) {
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }
      if (!field->has_label()) {
        RecordError("Expected \"required\", \"optional\", or \"repeated\".");
        // We can actually reasonably recover here by just assuming the user
        // forgot the label altogether.
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }

      // Handle the case where the actual type is a message or enum named
      // "map", which we already consumed in the code above.
      if (!type_parsed) {
        DO(ParseType(&type, &type_name));
      }
      if (type_name.empty()) {
        location.AddPath(FieldDescriptorProto::kTypeFieldNumber);
        field->set_type(type);
      } else {
        location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
        field->set_type_name(type_name);
      }
    }
  }

  // Parse name and '='.
  io::Tokenizer::Token name_token = input_->current();
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(field->mutable_name(), "Expected field name."));

    if (!IsLowerUnderscore(field->name())) {
      RecordWarning([=] {
        return absl::StrCat(
            "Field name should be lowercase. Found: ", field->name(),
            ". See: https://developers.google.com/protocol-buffers/docs/style");
      });
    }
    if (IsNumberFollowUnderscore(field->name())) {
      RecordWarning([=] {
        return absl::StrCat(
            "Number should not come right after an underscore. Found: ",
            field->name(),
            ". See: https://developers.google.com/protocol-buffers/docs/style");
      });
    }
  }
  DO(Consume("=", "Missing field number."));

  // Parse field number.
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(field,
                                  DescriptorPool::ErrorCollector::NUMBER);
    int number;
    DO(ConsumeInteger(&number, "Expected field number."));
    field->set_number(number);
  }

  // Parse options.
  DO(ParseFieldOptions(field, field_location, containing_file));

  // Deal with groups.
  if (field->has_type() && field->type() == FieldDescriptorProto::TYPE_GROUP) {
    // Awkward:  Since a group declares both a message type and a field, we
    //   have to create overlapping locations.
    LocationRecorder group_location(parent_location);
    group_location.StartAt(field_location);
    group_location.AddPath(location_field_number_for_nested_type);
    group_location.AddPath(messages->size());

    DescriptorProto* group = messages->Add();
    group->set_name(field->name());

    // Record name location to match the field name's location.
    {
      LocationRecorder location(group_location,
                                DescriptorProto::kNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
      location.RecordLegacyLocation(group,
                                    DescriptorPool::ErrorCollector::NAME);
    }

    // The field's type_name also comes from the name.  Confusing!
    {
      LocationRecorder location(field_location,
                                FieldDescriptorProto::kTypeNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
    }

    // As a hack for backwards-compatibility, we force the group name to start
    // with a capital letter and lower-case the field name.  New code should
    // not use groups; it should use nested messages.
    if (group->name()[0] < 'A' || 'Z' < group->name()[0]) {
      RecordError(name_token.line, name_token.column,
                  "Group names must start with a capital letter.");
    }
    absl::AsciiStrToLower(field->mutable_name());

    field->set_type_name(group->name());
    if (LookingAt("{")) {
      DO(ParseMessageBlock(group, group_location, containing_file));
    } else {
      RecordError("Missing group body.");
      return false;
    }
  } else {
    DO(ConsumeEndOfDeclaration(";", &field_location));
  }

  // Create a map entry type if this is a map field.
  if (map_field.is_map_field) {
    GenerateMapEntry(map_field, field, messages);
  }

  return true;
}